

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFactoryVk.cpp
# Opt level: O2

void __thiscall
Diligent::anon_unknown_0::EngineFactoryVkImpl::CreateSwapChainVk
          (EngineFactoryVkImpl *this,IRenderDevice *pDevice,IDeviceContext *pImmediateContext,
          SwapChainDesc *SCDesc,NativeWindow *Window,ISwapChain **ppSwapChain)

{
  SwapChainVkImpl *this_00;
  DeviceContextVkImpl *pDeviceContextVk;
  RenderDeviceVkImpl *pDeviceVk;
  string msg;
  DeviceContextVkImpl *local_58;
  RenderDeviceVkImpl *local_50;
  undefined1 local_48 [24];
  char *local_30;
  undefined4 local_28;
  
  if (ppSwapChain == (ISwapChain **)0x0) {
    FormatString<char[22]>((string *)local_48,(char (*) [22])"Null pointer provided");
    DebugAssertionFailed
              ((Char *)local_48._0_8_,"CreateSwapChainVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/EngineFactoryVk.cpp"
               ,0x5cb);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    *ppSwapChain = (ISwapChain *)0x0;
    local_50 = ClassPtrCast<Diligent::RenderDeviceVkImpl,Diligent::IRenderDevice>(pDevice);
    local_58 = ClassPtrCast<Diligent::DeviceContextVkImpl,Diligent::IDeviceContext>
                         (pImmediateContext);
    local_48._0_8_ = GetRawAllocator();
    local_48._8_8_ = 0;
    local_48._16_8_ = "SwapChainVkImpl instance";
    local_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/EngineFactoryVk.cpp"
    ;
    local_28 = 0x5d7;
    this_00 = MakeNewRCObj<Diligent::SwapChainVkImpl,Diligent::IMemoryAllocator>::operator()
                        ((MakeNewRCObj<Diligent::SwapChainVkImpl,Diligent::IMemoryAllocator> *)
                         local_48,SCDesc,&local_50,&local_58,Window);
    SwapChainVkImpl::QueryInterface(this_00,(INTERFACE_ID *)IID_SwapChain,(IObject **)ppSwapChain);
  }
  return;
}

Assistant:

void EngineFactoryVkImpl::CreateSwapChainVk(IRenderDevice*       pDevice,
                                            IDeviceContext*      pImmediateContext,
                                            const SwapChainDesc& SCDesc,
                                            const NativeWindow&  Window,
                                            ISwapChain**         ppSwapChain)
{
    DEV_CHECK_ERR(ppSwapChain, "Null pointer provided");
    if (!ppSwapChain)
        return;

    *ppSwapChain = nullptr;

    try
    {
        RenderDeviceVkImpl*  pDeviceVk        = ClassPtrCast<RenderDeviceVkImpl>(pDevice);
        DeviceContextVkImpl* pDeviceContextVk = ClassPtrCast<DeviceContextVkImpl>(pImmediateContext);
        IMemoryAllocator&    RawMemAllocator  = GetRawAllocator();

        SwapChainVkImpl* pSwapChainVk = NEW_RC_OBJ(RawMemAllocator, "SwapChainVkImpl instance", SwapChainVkImpl)(SCDesc, pDeviceVk, pDeviceContextVk, Window);
        pSwapChainVk->QueryInterface(IID_SwapChain, reinterpret_cast<IObject**>(ppSwapChain));
    }
    catch (const std::runtime_error&)
    {
        if (*ppSwapChain)
        {
            (*ppSwapChain)->Release();
            *ppSwapChain = nullptr;
        }

        LOG_ERROR("Failed to create the swap chain");
    }
}